

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O3

void __thiscall cmCTestGlobalVC::cmCTestGlobalVC(cmCTestGlobalVC *this,cmCTest *ct,ostream *log)

{
  _Rb_tree_header *p_Var1;
  
  cmCTestVC::cmCTestVC(&this->super_cmCTestVC,ct,log);
  (this->super_cmCTestVC)._vptr_cmCTestVC = (_func_int **)&PTR__cmCTestGlobalVC_00bbabd8;
  p_Var1 = &(this->Dirs)._M_t._M_impl.super__Rb_tree_header;
  (this->Dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Dirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Dirs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OldRevision)._M_dataplus._M_p = (pointer)&(this->OldRevision).field_2;
  (this->OldRevision)._M_string_length = 0;
  (this->OldRevision).field_2._M_local_buf[0] = '\0';
  (this->NewRevision)._M_dataplus._M_p = (pointer)&(this->NewRevision).field_2;
  (this->NewRevision)._M_string_length = 0;
  (this->NewRevision).field_2._M_local_buf[0] = '\0';
  (this->PriorRev).Rev._M_dataplus._M_p = (pointer)&(this->PriorRev).Rev.field_2;
  (this->PriorRev).Rev._M_string_length = 0;
  (this->PriorRev).Rev.field_2._M_local_buf[0] = '\0';
  (this->PriorRev).Date._M_dataplus._M_p = (pointer)&(this->PriorRev).Date.field_2;
  (this->PriorRev).Date._M_string_length = 0;
  (this->PriorRev).Date.field_2._M_local_buf[0] = '\0';
  (this->PriorRev).Author._M_dataplus._M_p = (pointer)&(this->PriorRev).Author.field_2;
  (this->PriorRev).Author._M_string_length = 0;
  (this->PriorRev).Author.field_2._M_local_buf[0] = '\0';
  (this->PriorRev).EMail._M_dataplus._M_p = (pointer)&(this->PriorRev).EMail.field_2;
  (this->PriorRev).EMail._M_string_length = 0;
  (this->PriorRev).EMail.field_2._M_local_buf[0] = '\0';
  (this->PriorRev).Committer._M_dataplus._M_p = (pointer)&(this->PriorRev).Committer.field_2;
  (this->PriorRev).Committer._M_string_length = 0;
  (this->PriorRev).Committer.field_2._M_local_buf[0] = '\0';
  (this->PriorRev).CommitterEMail._M_dataplus._M_p =
       (pointer)&(this->PriorRev).CommitterEMail.field_2;
  (this->PriorRev).CommitterEMail._M_string_length = 0;
  (this->PriorRev).CommitterEMail.field_2._M_local_buf[0] = '\0';
  (this->PriorRev).CommitDate._M_dataplus._M_p = (pointer)&(this->PriorRev).CommitDate.field_2;
  (this->PriorRev).CommitDate._M_string_length = 0;
  (this->PriorRev).CommitDate.field_2._M_local_buf[0] = '\0';
  (this->PriorRev).Log._M_dataplus._M_p = (pointer)&(this->PriorRev).Log.field_2;
  (this->PriorRev).Log._M_string_length = 0;
  (this->PriorRev).Log.field_2._M_local_buf[0] = '\0';
  (this->Revisions).super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->Revisions;
  (this->Revisions).super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->Revisions;
  (this->Revisions).super__List_base<cmCTestVC::Revision,_std::allocator<cmCTestVC::Revision>_>.
  _M_impl._M_node._M_size = 0;
  std::__cxx11::string::_M_assign((string *)&this->PriorRev);
  std::__cxx11::string::_M_assign((string *)&(this->PriorRev).Date);
  std::__cxx11::string::_M_assign((string *)&(this->PriorRev).Author);
  std::__cxx11::string::_M_assign((string *)&(this->PriorRev).EMail);
  std::__cxx11::string::_M_assign((string *)&(this->PriorRev).Committer);
  std::__cxx11::string::_M_assign((string *)&(this->PriorRev).CommitterEMail);
  std::__cxx11::string::_M_assign((string *)&(this->PriorRev).CommitDate);
  std::__cxx11::string::_M_assign((string *)&(this->PriorRev).Log);
  return;
}

Assistant:

cmCTestGlobalVC::cmCTestGlobalVC(cmCTest* ct, std::ostream& log)
  : cmCTestVC(ct, log)
{
  this->PriorRev = this->Unknown;
}